

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeLiteGenerator::CreateProjectFile
          (cmExtraCodeLiteGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  const_reference ppcVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string filename;
  undefined1 local_78 [8];
  string projectName;
  allocator local_41;
  undefined1 local_40 [8];
  string outputDir;
  cmMakefile *mf;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraCodeLiteGenerator *this_local;
  
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[](lgs,0);
  outputDir.field_2._8_8_ = cmLocalGenerator::GetMakefile(*ppcVar1);
  pcVar2 = cmMakefile::GetCurrentBinaryDirectory((cmMakefile *)outputDir.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,pcVar2,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pcVar2 = cmMakefile::GetProjectName((cmMakefile *)outputDir.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_78,pcVar2,(allocator *)(filename.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"/");
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 ".project");
  std::__cxx11::string::operator+=((string *)local_a0,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  CreateNewProjectFile(this,lgs,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  const cmMakefile* mf    = lgs[0]->GetMakefile();
  std::string outputDir   = mf->GetCurrentBinaryDirectory();
  std::string projectName = mf->GetProjectName();
  std::string filename    = outputDir + "/";

  filename += projectName + ".project";
  this->CreateNewProjectFile(lgs, filename);
}